

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

uint16_t fec23(uint16_t data)

{
  ushort local_12;
  int local_10;
  uint16_t codeword;
  int i;
  uint16_t data_local;
  
  local_12 = 0;
  for (local_10 = 0; local_10 < 10; local_10 = local_10 + 1) {
    if (((uint)data & 1 << ((byte)local_10 & 0x1f)) != 0) {
      local_12 = local_12 ^ fec23_gen_matrix[local_10];
    }
  }
  return local_12;
}

Assistant:

static uint16_t fec23(uint16_t data)
{
	int i;
	uint16_t codeword = 0;

	/* host order, not air order */
	for (i = 0; i < 10; i++)
		if (data & (1 << i))
			codeword ^= fec23_gen_matrix[i];

	return codeword;
}